

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O3

void __thiscall fs_logger::debug(fs_logger *this,string *log_line)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->fs_,(log_line->_M_dataplus)._M_p,log_line->_M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

virtual void debug(const std::string& log_line)
    {
        fs_ << log_line << std::endl;
        fs_.flush();
    }